

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O2

fullpath_ref_t GetInputFile(char **p)

{
  fullpath_ref_t pSVar1;
  delim_string_t name_in;
  delim_string_t local_30;
  
  GetDelimitedStringEx_abi_cxx11_(&local_30,p);
  pSVar1 = GetInputFile(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return pSVar1;
}

Assistant:

fullpath_ref_t GetInputFile(char*& p) {
	auto name_in = GetDelimitedStringEx(p);
	return GetInputFile(std::move(name_in));
}